

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

container_t * container_add(container_t *c,uint16_t val,uint8_t typecode,uint8_t *new_typecode)

{
  int iVar1;
  array_container_t *arr;
  bitset_container_t *bitset_00;
  bitset_container_t *bitset;
  array_container_t *ac;
  uint8_t *new_typecode_local;
  uint8_t typecode_local;
  array_container_t *paStack_18;
  uint16_t val_local;
  container_t *c_local;
  
  new_typecode_local._5_1_ = typecode;
  new_typecode_local._6_2_ = val;
  paStack_18 = (array_container_t *)c;
  arr = (array_container_t *)
        get_writable_copy_if_shared(c,(uint8_t *)((long)&new_typecode_local + 5));
  paStack_18 = arr;
  if (new_typecode_local._5_1_ == '\x01') {
    bitset_container_set((bitset_container_t *)arr,new_typecode_local._6_2_);
    *new_typecode = '\x01';
    c_local = paStack_18;
  }
  else if (new_typecode_local._5_1_ == '\x02') {
    iVar1 = array_container_try_add(arr,new_typecode_local._6_2_,0x1000);
    if (iVar1 == -1) {
      bitset_00 = bitset_container_from_array(arr);
      bitset_container_add(bitset_00,new_typecode_local._6_2_);
      *new_typecode = '\x01';
      c_local = bitset_00;
    }
    else {
      *new_typecode = '\x02';
      c_local = arr;
    }
  }
  else {
    if (new_typecode_local._5_1_ != '\x03') {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x120e,
                    "container_t *container_add(container_t *, uint16_t, uint8_t, uint8_t *)");
    }
    run_container_add((run_container_t *)arr,new_typecode_local._6_2_);
    *new_typecode = '\x03';
    c_local = paStack_18;
  }
  return c_local;
}

Assistant:

static inline container_t *container_add(
    container_t *c, uint16_t val,
    uint8_t typecode,  // !!! should be second argument?
    uint8_t *new_typecode
){
    c = get_writable_copy_if_shared(c, &typecode);
    switch (typecode) {
        case BITSET_CONTAINER_TYPE:
            bitset_container_set(CAST_bitset(c), val);
            *new_typecode = BITSET_CONTAINER_TYPE;
            return c;
        case ARRAY_CONTAINER_TYPE: {
            array_container_t *ac = CAST_array(c);
            if (array_container_try_add(ac, val, DEFAULT_MAX_SIZE) != -1) {
                *new_typecode = ARRAY_CONTAINER_TYPE;
                return ac;
            } else {
                bitset_container_t* bitset = bitset_container_from_array(ac);
                bitset_container_add(bitset, val);
                *new_typecode = BITSET_CONTAINER_TYPE;
                return bitset;
            }
        } break;
        case RUN_CONTAINER_TYPE:
            // per Java, no container type adjustments are done (revisit?)
            run_container_add(CAST_run(c), val);
            *new_typecode = RUN_CONTAINER_TYPE;
            return c;
        default:
            assert(false);
            __builtin_unreachable();
            return NULL;
    }
}